

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcomp.c
# Opt level: O3

uint objemt(mcmcxdef *ctx,objnum objn,prpnum prop,dattyp typ)

{
  ushort *puVar1;
  ushort uVar2;
  ushort uVar3;
  errcxdef *peVar4;
  uint16_t tmp;
  uchar *puVar5;
  objdef *poVar6;
  prpnum *ppVar7;
  uchar *puVar8;
  ushort newsiz;
  errdef fr_;
  ushort local_16a;
  errdef local_168;
  
  puVar5 = mcmlck(ctx,objn);
  local_168.errcode = _setjmp((__jmp_buf_tag *)local_168.errbuf);
  if (local_168.errcode == 0) {
    peVar4 = ctx->mcmcxgl->mcmcxerr;
    local_168.errprv = peVar4->errcxptr;
    peVar4->errcxptr = &local_168;
    objdelp(ctx,objn,prop,0);
    uVar2 = *(ushort *)(puVar5 + 8);
    poVar6 = (objdef *)(ulong)uVar2;
    uVar3 = *(ushort *)
             ((long)&ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[objn >> 8][objn & 0xff] >> 8]->mcmosiz +
             (ulong)((ctx->mcmcxmtb[objn >> 8][objn & 0xff] & 0xff) << 5));
    puVar8 = puVar5;
    if ((uint)uVar3 <= uVar2 + 6) {
      local_16a = (uVar2 - uVar3) + 0x46;
      poVar6 = objexp(ctx,objn,&local_16a);
      puVar5 = (uchar *)(ulong)*(ushort *)(poVar6 + 8);
      puVar8 = poVar6;
    }
    ppVar7 = (prpnum *)(puVar5 + (long)poVar6);
    *ppVar7 = prop;
    *(uchar *)(ppVar7 + 1) = (uchar)typ;
    *(uchar *)((long)ppVar7 + 5) = '\0';
    *(short *)(puVar8 + 6) = *(short *)(puVar8 + 6) + 1;
    ctx->mcmcxgl->mcmcxerr->errcxptr = local_168.errprv;
    puVar1 = (ushort *)
             ((long)&ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[objn >> 8][objn & 0xff] >> 8]->mcmoflg +
             (ulong)((ctx->mcmcxmtb[objn >> 8][objn & 0xff] & 0xff) << 5));
    *puVar1 = *puVar1 | 1;
    mcmunlck(ctx,objn);
    return ((int)ppVar7 - (int)puVar8) + 6;
  }
  ctx->mcmcxgl->mcmcxerr->errcxptr = local_168.errprv;
  mcmunlck(ctx,objn);
  errrse1(ctx->mcmcxgl->mcmcxerr,&local_168);
}

Assistant:

uint objemt(mcmcxdef *ctx, objnum objn, prpnum prop, dattyp typ)
{
    objdef *objptr;
    prpdef *p;
    
    objptr = (objdef *)mcmlck(ctx, (mcmon)objn);
    
    ERRBEGIN(ctx->mcmcxgl->mcmcxerr)

    objdelp(ctx, objn, prop, FALSE);   /* delete old property value, if any */
    p = objpfre(objptr);                        /* get top of property area */
    
    if ((char *)p - (char *)objptr + PRPHDRSIZ >=
        mcmobjsiz(ctx, (mcmon)objn))
    {
        ushort newsiz = 64 + ((objfree(objptr) + PRPHDRSIZ) -
                              mcmobjsiz(ctx, (mcmon)objn));
        objptr = objexp(ctx, objn, &newsiz);
        p = objpfre(objptr);                       /* object may have moved */
    }
    
    /* set up property header as much as we can (don't know size yet) */
    prpsetprop(p, prop);
    prptype(p) = typ;
    prpflg(p) = 0;
    objsnp(objptr, objnprop(objptr) + 1);              /* one more property */

    ERRCLEAN(ctx->mcmcxgl->mcmcxerr)
        mcmunlck(ctx, (mcmon)objn);
    ERRENDCLN(ctx->mcmcxgl->mcmcxerr)

    /* dirty the cache object and release the lock before return */
    mcmtch(ctx, objn);
    mcmunlck(ctx, (mcmon)objn);
    return(((uchar *)prpvalp(p)) - ((uchar *)objptr));
}